

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O1

void Bitmap_format_Matrix(uint8_t *dst,uint8_t *src)

{
  byte bVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  uint uVar7;
  uint8_t *puVar8;
  ulong uVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  long lVar12;
  byte *pbVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  
  if (bmp_BitCount < 0x10) {
    if (bmp_BitCount == '\x01') {
      if (bmp_height != 0) {
        puVar10 = dst + bmp_height * bmp_width;
        uVar4 = 0;
        do {
          uVar9 = (ulong)bmp_width;
          lVar14 = (long)puVar10 - uVar9;
          if (7 < bmp_width + 7) {
            uVar16 = 0;
            uVar6 = 0;
            do {
              lVar12 = lVar14;
              bVar1 = src[uVar16];
              bVar3 = 7;
              lVar15 = 0;
              do {
                uVar7 = (uint)lVar15;
                *(char *)(lVar12 + lVar15) =
                     (char)((0x80U >> ((byte)lVar15 & 0x1f) & (uint)bVar1) >> (bVar3 & 0x1f));
                uVar6 = uVar6 + 1;
                lVar15 = lVar15 + 1;
                if (uVar6 == bmp_width) break;
                bVar3 = bVar3 - 1;
              } while (uVar7 < 7);
              uVar16 = uVar16 + 1;
              uVar9 = (ulong)bmp_width;
              lVar14 = lVar12 + lVar15;
            } while (uVar16 < bmp_width + 7 >> 3);
            lVar14 = lVar12 + lVar15;
          }
          puVar10 = (uint8_t *)(lVar14 - uVar9);
          src = src + bytesPerLine;
          uVar4 = uVar4 + 1;
        } while (uVar4 < bmp_height);
      }
    }
    else if (bmp_BitCount == '\x04') {
      if (bmp_height != 0) {
        pbVar13 = dst + bmp_height * bmp_width;
        uVar4 = 0;
        do {
          if (bmp_width + 1 < 2) {
            pbVar13 = pbVar13 + -(ulong)bmp_width;
          }
          else {
            uVar6 = 2;
            uVar9 = 0;
            pbVar2 = pbVar13 + (1 - (ulong)bmp_width);
            do {
              pbVar13 = pbVar2;
              bVar1 = src[uVar9];
              pbVar13[-1] = bVar1 >> 4;
              if (uVar6 - 1 == bmp_width) goto LAB_00105d02;
              *pbVar13 = bVar1 & 0xf;
              if (uVar6 == bmp_width) break;
              uVar9 = uVar9 + 1;
              uVar6 = uVar6 + 2;
              pbVar2 = pbVar13 + 2;
            } while (uVar9 < bmp_width + 1 >> 1);
            pbVar13 = pbVar13 + 1;
          }
LAB_00105d02:
          pbVar13 = pbVar13 + -(ulong)bmp_width;
          src = src + bytesPerLine;
          uVar4 = uVar4 + 1;
        } while (uVar4 < bmp_height);
      }
    }
    else if ((bmp_BitCount == '\b') && (bmp_height != 0)) {
      puVar10 = dst + bmp_height * bmp_width;
      uVar4 = 0;
      iVar5 = 1;
      do {
        if (bmp_width != 0) {
          uVar9 = (ulong)skip;
          uVar7 = bytesPerLine * iVar5;
          lVar15 = -1;
          lVar14 = 0;
          do {
            puVar10[lVar15] = src[lVar15 + (uVar7 - uVar9)];
            lVar15 = lVar15 + -1;
            lVar14 = lVar14 + 1;
          } while ((uint)lVar14 < bmp_width);
          puVar10 = puVar10 + -lVar14;
        }
        uVar4 = uVar4 + 1;
        iVar5 = iVar5 + 1;
      } while (uVar4 < bmp_height);
    }
  }
  else if (bmp_BitCount == '\x10') {
    if (bmp_height != 0) {
      puVar10 = dst + bmp_height * bmp_width * 2;
      uVar4 = 0;
      iVar5 = 1;
      do {
        if (bmp_width != 0) {
          puVar8 = src + ((ulong)(bytesPerLine * iVar5) - (ulong)skip) + -1;
          uVar7 = 0;
          puVar11 = puVar10;
          do {
            puVar10 = puVar11 + -2;
            puVar11[-2] = *puVar8;
            puVar11[-1] = puVar8[-1];
            uVar7 = uVar7 + 1;
            puVar8 = puVar8 + -2;
            puVar11 = puVar10;
          } while (uVar7 < bmp_width);
        }
        uVar4 = uVar4 + 1;
        iVar5 = iVar5 + 1;
      } while (uVar4 < bmp_height);
    }
  }
  else if (bmp_BitCount == '\x18') {
    if (bmp_height != 0) {
      puVar10 = dst + bmp_height * bmp_width * 3;
      uVar4 = 0;
      iVar5 = 1;
      do {
        if (bmp_width != 0) {
          puVar8 = src + ((ulong)(bytesPerLine * iVar5) - (ulong)skip) + -1;
          uVar7 = 0;
          puVar11 = puVar10;
          do {
            puVar10 = puVar11 + -3;
            puVar11[-3] = *puVar8;
            puVar11[-2] = puVar8[-1];
            puVar11[-1] = puVar8[-2];
            uVar7 = uVar7 + 1;
            puVar8 = puVar8 + -3;
            puVar11 = puVar10;
          } while (uVar7 < bmp_width);
        }
        uVar4 = uVar4 + 1;
        iVar5 = iVar5 + 1;
      } while (uVar4 < bmp_height);
    }
  }
  else if ((bmp_BitCount == ' ') && (bmp_height != 0)) {
    puVar10 = dst + bmp_height * bmp_width * 4;
    uVar4 = 0;
    iVar5 = 4;
    do {
      if (bmp_width != 0) {
        puVar8 = src + ((ulong)(bmp_width * iVar5) - 1);
        uVar7 = 0;
        puVar11 = puVar10;
        do {
          puVar10 = puVar11 + -4;
          puVar11[-4] = puVar8[-1];
          puVar11[-3] = puVar8[-2];
          puVar11[-2] = puVar8[-3];
          puVar11[-1] = *puVar8;
          uVar7 = uVar7 + 1;
          puVar8 = puVar8 + -4;
          puVar11 = puVar10;
        } while (uVar7 < bmp_width);
      }
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + 4;
    } while (uVar4 < bmp_height);
  }
  return;
}

Assistant:

static void Bitmap_format_Matrix(uint8_t *dst,uint8_t *src)
{
	uint32_t i,j,k;
    uint8_t *psrc = src;
    uint8_t *pdst = dst;
    uint8_t *p = psrc;
	uint8_t temp;
	uint32_t count;
	
	//����bmp�洢�ǴӺ�����ǰ�棬������Ҫ��������ת��
	switch(bmp_BitCount)
	{
		case 1:
			pdst += (bmp_width * bmp_height);
			
			for(i=0;i<bmp_height;i++)
			{
				pdst -= bmp_width;
				count = 0;
				for (j=0;j<(bmp_width+7)/8;j++)
				{
					temp = p[j];
					
					for (k=0;k<8;k++)
					{
						pdst[0]= ((temp & (0x80>>k)) >> (7-k));
						count++;
						pdst++;
						if (count == bmp_width)
						{
							break;
						}
					}
				}
				pdst -= bmp_width;
				p += bytesPerLine;
			}
		break;
		case 4:
			pdst += (bmp_width * bmp_height);

			for(i=0;i<bmp_height;i++)
			{
				pdst -= bmp_width;
				count = 0;
				for (j=0;j<(bmp_width+1)/2;j++)
				{
					temp = p[j];
					pdst[0]= ((temp & 0xf0) >> 4);
					count++;
					pdst++;
					if (count == bmp_width)
					{
						break;
					}

					pdst[0] = temp & 0x0f;
					count++;
					pdst++;
					if (count == bmp_width)
					{
						break;
					}
				}
				pdst -= bmp_width;
				p += bytesPerLine;
			}
		break;
		case 8:
			pdst += (bmp_width*bmp_height);
			for(i=0;i<bmp_height;i++)
			{
				p = psrc+(i+1)*bytesPerLine;
				p -= skip;
				for(j=0;j<bmp_width;j++)
				{
					pdst -= 1;
					p -= 1;
					pdst[0] = p[0];
				}
			}
		break;
		case 16:
			pdst += (bmp_width*bmp_height*2);
			for(i=0;i<bmp_height;i++)
			{
				p = psrc+(i+1)*bytesPerLine;
				p -= skip;
				for(j=0;j<bmp_width;j++)
				{
					pdst -= 2;
					p -= 2;
					pdst[0] = p[1];
					pdst[1] = p[0];
				}
			}
		break;
		case 24:
			pdst += (bmp_width*bmp_height*3);
			for(i=0;i<bmp_height;i++)
			{
				p = psrc+(i+1)*bytesPerLine;
				p -= skip;
				for(j=0;j<bmp_width;j++)
				{
					pdst -= 3;
					p -= 3;
					pdst[0] = p[2];
					pdst[1] = p[1];
					pdst[2] = p[0];
				}
			}
		break;
		case 32:
			pdst += (bmp_width*bmp_height*4);
			for(i=0;i<bmp_height;i++)
			{
				p = psrc+(i+1)*bmp_width*4;
				for(j=0;j<bmp_width;j++)
				{
					pdst -= 4;
					p -= 4;
					pdst[0] = p[2];
					pdst[1] = p[1];
					pdst[2] = p[0];
					pdst[3] = p[3];
				}
			}
		break;
		
		default:
		break;
	}	
}